

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MismatchedTokenException.cpp
# Opt level: O0

void __thiscall
antlr::MismatchedTokenException::MismatchedTokenException
          (MismatchedTokenException *this,char **tokenNames_,int numTokens_,RefToken *token_,
          int expecting_,bool matchNot,string *fileName_)

{
  BitSet *pBVar1;
  int iVar2;
  Token *pTVar3;
  TokenRefCount<antlr::Token> *in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  BitSet *in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  AST *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  uint nbits;
  allocator<char> local_49;
  string local_48 [35];
  byte local_25;
  undefined4 local_24;
  undefined4 local_14;
  undefined8 local_10;
  
  local_25 = in_R9B & 1;
  local_24 = in_R8D;
  local_14 = in_EDX;
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             (allocator<char> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  pTVar3 = TokenRefCount<antlr::Token>::operator->(in_RCX);
  (*pTVar3->_vptr_Token[3])();
  pTVar3 = TokenRefCount<antlr::Token>::operator->(in_RCX);
  iVar2 = (*pTVar3->_vptr_Token[2])();
  RecognitionException::RecognitionException
            ((RecognitionException *)CONCAT44(iVar2,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),(int)in_stack_ffffffffffffff48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  (in_RDI->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)&PTR__MismatchedTokenException_00500b38;
  TokenRefCount<antlr::Token>::TokenRefCount
            ((TokenRefCount<antlr::Token> *)in_stack_ffffffffffffff50,
             (TokenRefCount<antlr::Token> *)in_stack_ffffffffffffff48);
  ASTRefCount<antlr::AST>::ASTRefCount
            ((ASTRefCount<antlr::AST> *)
             &in_RDI[2].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset,
             in_stack_ffffffffffffff48);
  pBVar1 = in_RDI + 2;
  pTVar3 = TokenRefCount<antlr::Token>::operator->(in_RCX);
  nbits = (uint)((ulong)in_RCX >> 0x20);
  (*pTVar3->_vptr_Token[4])
            (&(pBVar1->storage).super__Bvector_base<std::allocator<bool>_>._M_impl.
              super__Bvector_impl_data._M_finish);
  in_RDI[3].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = (local_25 & 1) + 1;
  *(undefined4 *)
   &in_RDI[3].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base.field_0xc = local_24;
  BitSet::BitSet(in_RDI,nbits);
  *(undefined8 *)
   &in_RDI[4].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_offset = local_10;
  *(undefined4 *)
   &in_RDI[4].storage.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = local_14;
  return;
}

Assistant:

MismatchedTokenException::MismatchedTokenException(
	const char* const* tokenNames_,
	const int numTokens_,
	RefToken token_,
	int expecting_,
	bool matchNot,
	const ANTLR_USE_NAMESPACE(std)string& fileName_
) : RecognitionException("Mismatched Token",fileName_,token_->getLine(),token_->getColumn())
  , token(token_)
  , node(nullASTptr)
  , tokenText(token_->getText())
  , mismatchType(matchNot ? NOT_TOKEN : TOKEN)
  , expecting(expecting_)
  , tokenNames(tokenNames_)
  , numTokens(numTokens_)
{
}